

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O2

void Sat_MmFlexStop(Sat_MmFlex_t *p,int fVerbose)

{
  char *__ptr;
  long lVar1;
  
  if (p != (Sat_MmFlex_t *)0x0) {
    if (fVerbose != 0) {
      printf("Flexible memory manager: Chunk size = %d. Chunks used = %d.\n",
             (ulong)(uint)p->nChunkSize,(ulong)(uint)p->nChunks);
      printf("   Entries used = %d. Memory used = %d. Memory alloc = %d.\n",
             (ulong)(uint)p->nEntriesUsed,(ulong)(uint)p->nMemoryUsed,(ulong)(uint)p->nMemoryAlloc);
    }
    for (lVar1 = 0; lVar1 < p->nChunks; lVar1 = lVar1 + 1) {
      __ptr = p->pChunks[lVar1];
      if (__ptr != (char *)0x0) {
        free(__ptr);
        p->pChunks[lVar1] = (char *)0x0;
      }
    }
    free(p->pChunks);
    free(p);
    return;
  }
  return;
}

Assistant:

void Sat_MmFlexStop( Sat_MmFlex_t * p, int fVerbose )
{
    int i;
    if ( p == NULL )
        return;
    if ( fVerbose )
    {
        printf( "Flexible memory manager: Chunk size = %d. Chunks used = %d.\n",
            p->nChunkSize, p->nChunks );
        printf( "   Entries used = %d. Memory used = %d. Memory alloc = %d.\n",
            p->nEntriesUsed, p->nMemoryUsed, p->nMemoryAlloc );
    }
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}